

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O0

IDenseNetwork * __thiscall
IDenseNetwork::GradStep
          (IDenseNetwork *this,size_t batchSize,float learningRateV,float learningRateW,float beta,
          float lambda)

{
  value_type pIVar1;
  bool bVar2;
  reference ppIVar3;
  reference ppIVar4;
  ILayer *layer;
  iterator __end1;
  iterator __begin1;
  vector<ILayer_*,_std::allocator<ILayer_*>_> *__range1;
  size_t ldx;
  float lambda_local;
  float beta_local;
  float learningRateW_local;
  float learningRateV_local;
  size_t batchSize_local;
  IDenseNetwork *this_local;
  
  __range1 = (vector<ILayer_*,_std::allocator<ILayer_*>_> *)
             std::vector<ILayer_*,_std::allocator<ILayer_*>_>::size(&this->layers);
  while (__range1 = (vector<ILayer_*,_std::allocator<ILayer_*>_> *)
                    ((long)&__range1[-1].super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
        __range1 != (vector<ILayer_*,_std::allocator<ILayer_*>_> *)0x0) {
    ppIVar3 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::operator[]
                        (&this->layers,(size_type)__range1);
    pIVar1 = *ppIVar3;
    std::vector<ILayer_*,_std::allocator<ILayer_*>_>::size(&this->layers);
    (*pIVar1->_vptr_ILayer[8])(learningRateV,learningRateW,beta,lambda,pIVar1,batchSize,0);
  }
  ppIVar3 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::front(&this->layers);
  (*(*ppIVar3)->_vptr_ILayer[8])(learningRateV,learningRateW,beta,lambda,*ppIVar3,batchSize,1,0);
  __end1 = std::vector<ILayer_*,_std::allocator<ILayer_*>_>::begin(&this->layers);
  layer = (ILayer *)std::vector<ILayer_*,_std::allocator<ILayer_*>_>::end(&this->layers);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>
                                *)&layer);
    if (!bVar2) break;
    ppIVar4 = __gnu_cxx::
              __normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>::
              operator*(&__end1);
    (*(*ppIVar4)->_vptr_ILayer[7])();
    __gnu_cxx::__normal_iterator<ILayer_**,_std::vector<ILayer_*,_std::allocator<ILayer_*>_>_>::
    operator++(&__end1);
  }
  return this;
}

Assistant:

IDenseNetwork &IDenseNetwork::GradStep( size_t batchSize, float learningRateV, float learningRateW, float beta,
                                        float lambda )
{
    for ( size_t ldx = layers.size() - 1; ldx > 0; --ldx ) {
        layers[ldx]->GradStep( batchSize, learningRateV, learningRateW, beta, false, lambda, ldx == layers.size() - 1 );
    }
    layers.front()->GradStep( batchSize, learningRateV, learningRateW, beta, true, lambda, false );
    for ( auto layer: layers ) {
        layer->ResetGrad();
    }
    return *this;
}